

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void server_closing(Plug *plug,PlugCloseType type,char *error_msg)

{
  server *srv;
  char *error_msg_local;
  PlugCloseType type_local;
  Plug *plug_local;
  
  if (type == PLUGCLOSE_NORMAL) {
    if (plug[0xe].vt != (PlugVtable *)0x0) {
      *(undefined1 *)&(plug[0xe].vt)->sent = 1;
      queue_idempotent_callback((IdempotentCallback *)&plug[0xe].vt[4].closing);
    }
  }
  else {
    ssh_remote_error((Ssh *)(plug + 0xc),"%s",error_msg);
  }
  return;
}

Assistant:

static void server_closing(Plug *plug, PlugCloseType type,
                           const char *error_msg)
{
    server *srv = container_of(plug, server, plug);
    if (type != PLUGCLOSE_NORMAL) {
        ssh_remote_error(&srv->ssh, "%s", error_msg);
    } else if (srv->bpp) {
        srv->bpp->input_eof = true;
        queue_idempotent_callback(&srv->bpp->ic_in_raw);
    }
}